

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__filename;
  size_type sVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  int *piVar7;
  void *in_R8;
  char *binpath;
  bool bVar8;
  value_type *__val;
  float scale;
  vector<float,_std::allocator<float>_> scales;
  string key_str;
  NetQuantize quantizer;
  char key [256];
  float local_30c;
  Mat local_308;
  float *local_2b8;
  iterator iStack_2b0;
  float *local_2a8;
  char *local_2a0;
  float *local_298;
  int *local_290;
  undefined8 local_288;
  undefined4 local_280;
  long *local_278;
  undefined4 local_270;
  int local_26c;
  undefined8 local_268;
  undefined4 local_260;
  long local_258;
  key_type local_250;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  NetQuantize local_210;
  DataReader local_138 [33];
  
  if (argc != 6) {
    main_cold_1();
    return -1;
  }
  local_218 = argv[1];
  pcVar3 = argv[2];
  pcVar4 = argv[3];
  binpath = argv[4];
  __filename = argv[5];
  ModelWriter::ModelWriter(&local_210.super_ModelWriter);
  local_210.super_ModelWriter.super_Net._vptr_Net = (_func_int **)&PTR__NetQuantize_00583180;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__filename != (char *)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
    ::clear(&local_210.blob_int8scale_table._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
    ::clear(&local_210.weight_int8scale_table._M_t);
    __stream = fopen(__filename,"rb");
    if (__stream == (FILE *)0x0) {
      main_cold_2();
      iVar2 = -1;
      goto LAB_00165499;
    }
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    local_250._M_string_length = 0;
    local_250.field_2._M_local_buf[0] = '\0';
    local_2a8 = (float *)0x0;
    local_2b8 = (float *)0x0;
    iStack_2b0._M_current = (float *)0x0;
    local_230 = pcVar3;
    local_228 = binpath;
    local_220 = pcVar4;
    pcVar3 = (char *)operator_new(0x9c4000);
    memset(pcVar3,0,0x9c4000);
    iVar2 = feof(__stream);
    if (iVar2 == 0) {
      local_2a0 = pcVar3;
      do {
        pcVar4 = fgets(pcVar3,0x9c4000,__stream);
        if (pcVar4 == (char *)0x0) break;
        local_30c = 1.0;
        sVar5 = strcspn(pcVar3,"\r\n");
        pcVar3[sVar5] = '\0';
        pcVar4 = strtok(pcVar3," ");
        if (pcVar4 == (char *)0x0) break;
        bVar8 = true;
        do {
          if (bVar8) {
            __isoc99_sscanf(pcVar4,"%255s",local_138);
            sVar1 = local_250._M_string_length;
            in_R8 = (void *)strlen((char *)local_138);
            std::__cxx11::string::_M_replace((ulong)&local_250,0,(char *)sVar1,(ulong)local_138);
          }
          else {
            __isoc99_sscanf(pcVar4,"%f",&local_30c);
            if (iStack_2b0._M_current == local_2a8) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_2b8,iStack_2b0,&local_30c);
            }
            else {
              *iStack_2b0._M_current = local_30c;
              iStack_2b0._M_current = iStack_2b0._M_current + 1;
            }
          }
          bVar8 = false;
          pcVar4 = strtok((char *)0x0," ");
        } while (pcVar4 != (char *)0x0);
        pcVar3 = strstr(local_250._M_dataplus._M_p,"_param_");
        if (pcVar3 == (char *)0x0) {
          local_298 = local_2b8;
          local_290 = (int *)0x0;
          local_288 = 4;
          local_280 = 1;
          local_278 = (long *)0x0;
          local_270 = 1;
          local_26c = (int)((ulong)((long)iStack_2b0._M_current - (long)local_2b8) >> 2);
          local_268 = 0x100000001;
          local_260 = 1;
          local_258 = (long)local_26c;
          ncnn::Mat::clone(&local_308,(__fn *)&local_298,(void *)0x0,local_26c,in_R8);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                   ::operator[](&local_210.blob_int8scale_table,&local_250);
          piVar7 = (int *)CONCAT44(local_308.refcount._4_4_,local_308.refcount._0_4_);
          if (pmVar6 != &local_308) {
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + 1;
              UNLOCK();
            }
            piVar7 = pmVar6->refcount;
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                if (pmVar6->allocator == (Allocator *)0x0) {
                  if (pmVar6->data != (void *)0x0) {
                    free(pmVar6->data);
                  }
                }
                else {
                  (*pmVar6->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pmVar6->cstep = 0;
            pmVar6->data = (void *)0x0;
            pmVar6->refcount = (int *)0x0;
            *(undefined8 *)((long)&pmVar6->refcount + 4) = 0;
            *(undefined8 *)((long)&pmVar6->elemsize + 4) = 0;
            pmVar6->dims = 0;
            pmVar6->w = 0;
            pmVar6->h = 0;
            pmVar6->d = 0;
            pmVar6->c = 0;
            pmVar6->data = local_308.data;
            piVar7 = (int *)CONCAT44(local_308.refcount._4_4_,local_308.refcount._0_4_);
            pmVar6->refcount = piVar7;
            pmVar6->elemsize = CONCAT44(local_308.elemsize._4_4_,(undefined4)local_308.elemsize);
            pmVar6->elempack = local_308.elempack;
            pmVar6->allocator = local_308.allocator;
            pmVar6->dims = local_308.dims;
            pmVar6->w = local_308.w;
            pmVar6->h = local_308.h;
            pmVar6->d = local_308.d;
            pmVar6->c = local_308.c;
            pmVar6->cstep = local_308.cstep;
          }
          pcVar3 = local_2a0;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_308.allocator == (Allocator *)0x0) {
                if (local_308.data != (void *)0x0) {
                  free(local_308.data);
                }
              }
              else {
                (*(local_308.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_308.cstep = 0;
          local_308.data = (void *)0x0;
          local_308.refcount._0_4_ = 0;
          local_308.refcount._4_4_ = 0;
          local_308.elemsize._0_4_ = 0;
          local_308.elemsize._4_4_ = 0;
          local_308.elempack = 0;
          local_308.dims = 0;
          local_308.w = 0;
          local_308.h = 0;
          local_308.d = 0;
          local_308.c = 0;
          if (local_290 != (int *)0x0) {
            LOCK();
            *local_290 = *local_290 + -1;
            UNLOCK();
            if (*local_290 == 0) {
              if (local_278 == (long *)0x0) goto LAB_001659ce;
              (**(code **)(*local_278 + 0x18))();
            }
          }
        }
        else {
          local_298 = local_2b8;
          local_290 = (int *)0x0;
          local_288 = 4;
          local_280 = 1;
          local_278 = (long *)0x0;
          local_270 = 1;
          local_26c = (int)((ulong)((long)iStack_2b0._M_current - (long)local_2b8) >> 2);
          local_268 = 0x100000001;
          local_260 = 1;
          local_258 = (long)local_26c;
          ncnn::Mat::clone(&local_308,(__fn *)&local_298,(void *)0x0,local_26c,in_R8);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                   ::operator[](&local_210.weight_int8scale_table,&local_250);
          piVar7 = (int *)CONCAT44(local_308.refcount._4_4_,local_308.refcount._0_4_);
          if (pmVar6 != &local_308) {
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + 1;
              UNLOCK();
            }
            piVar7 = pmVar6->refcount;
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                if (pmVar6->allocator == (Allocator *)0x0) {
                  if (pmVar6->data != (void *)0x0) {
                    free(pmVar6->data);
                  }
                }
                else {
                  (*pmVar6->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pmVar6->cstep = 0;
            pmVar6->data = (void *)0x0;
            pmVar6->refcount = (int *)0x0;
            *(undefined8 *)((long)&pmVar6->refcount + 4) = 0;
            *(undefined8 *)((long)&pmVar6->elemsize + 4) = 0;
            pmVar6->dims = 0;
            pmVar6->w = 0;
            pmVar6->h = 0;
            pmVar6->d = 0;
            pmVar6->c = 0;
            pmVar6->data = local_308.data;
            piVar7 = (int *)CONCAT44(local_308.refcount._4_4_,local_308.refcount._0_4_);
            pmVar6->refcount = piVar7;
            pmVar6->elemsize = CONCAT44(local_308.elemsize._4_4_,(undefined4)local_308.elemsize);
            pmVar6->elempack = local_308.elempack;
            pmVar6->allocator = local_308.allocator;
            pmVar6->dims = local_308.dims;
            pmVar6->w = local_308.w;
            pmVar6->h = local_308.h;
            pmVar6->d = local_308.d;
            pmVar6->c = local_308.c;
            pmVar6->cstep = local_308.cstep;
          }
          pcVar3 = local_2a0;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_308.allocator == (Allocator *)0x0) {
                if (local_308.data != (void *)0x0) {
                  free(local_308.data);
                }
              }
              else {
                (*(local_308.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_308.cstep = 0;
          local_308.data = (void *)0x0;
          local_308.refcount._0_4_ = 0;
          local_308.refcount._4_4_ = 0;
          local_308.elemsize._0_4_ = 0;
          local_308.elemsize._4_4_ = 0;
          local_308.elempack = 0;
          local_308.dims = 0;
          local_308.w = 0;
          local_308.h = 0;
          local_308.d = 0;
          local_308.c = 0;
          if (local_290 != (int *)0x0) {
            LOCK();
            *local_290 = *local_290 + -1;
            UNLOCK();
            if (*local_290 == 0) {
              if (local_278 == (long *)0x0) {
LAB_001659ce:
                local_308.cstep = 0;
                local_308.c = 0;
                local_308.h = 0;
                local_308.d = 0;
                local_308.dims = 0;
                local_308.w = 0;
                local_308.elempack = 0;
                local_308.elemsize._4_4_ = 0;
                local_308.elemsize._0_4_ = 0;
                local_308.refcount._4_4_ = 0;
                local_308.refcount._0_4_ = 0;
                local_308.data = (void *)0x0;
                if (local_298 != (float *)0x0) {
                  free(local_298);
                }
              }
              else {
                (**(code **)(*local_278 + 0x18))();
              }
            }
          }
        }
        local_250._M_string_length = 0;
        *local_250._M_dataplus._M_p = '\0';
        if (iStack_2b0._M_current != local_2b8) {
          iStack_2b0._M_current = local_2b8;
        }
        iVar2 = feof(__stream);
      } while (iVar2 == 0);
    }
    fclose(__stream);
    operator_delete(pcVar3);
    if (local_2b8 != (float *)0x0) {
      operator_delete(local_2b8);
    }
    pcVar4 = local_220;
    binpath = local_228;
    pcVar3 = local_230;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
  }
  ncnn::Net::load_param((Net *)&local_210,local_218);
  iVar2 = strcmp(pcVar3,"null");
  if (iVar2 == 0) {
    ncnn::DataReader::DataReader(local_138);
    local_138[0]._vptr_DataReader = (_func_int **)&PTR__DataReader_00583290;
    ncnn::Net::load_model((Net *)&local_210,local_138);
    local_210.super_ModelWriter.gen_random_weight = 1;
    ncnn::DataReader::~DataReader(local_138);
  }
  else {
    ncnn::Net::load_model((Net *)&local_210,pcVar3);
  }
  NetQuantize::quantize_convolution(&local_210);
  NetQuantize::quantize_convolutiondepthwise(&local_210);
  NetQuantize::quantize_innerproduct(&local_210);
  NetQuantize::fuse_requantize(&local_210);
  iVar2 = 0;
  ModelWriter::save(&local_210.super_ModelWriter,pcVar4,binpath);
LAB_00165499:
  local_210.super_ModelWriter.super_Net._vptr_Net = (_func_int **)&PTR__NetQuantize_00583180;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  ::~_Rb_tree(&local_210.weight_int8scale_table._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  ::~_Rb_tree(&local_210.blob_int8scale_table._M_t);
  ncnn::Net::~Net((Net *)&local_210);
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 6)
    {
        fprintf(stderr, "usage: %s [inparam] [inbin] [outparam] [outbin] [calibration table]\n", argv[0]);
        return -1;
    }

    const char* inparam = argv[1];
    const char* inbin = argv[2];
    const char* outparam = argv[3];
    const char* outbin = argv[4];
    const char* int8scale_table_path = argv[5];

    NetQuantize quantizer;

    // parse the calibration scale table
    if (int8scale_table_path)
    {
        bool s2 = read_int8scale_table(int8scale_table_path, quantizer.blob_int8scale_table, quantizer.weight_int8scale_table);
        if (!s2)
        {
            fprintf(stderr, "read_int8scale_table failed\n");
            return -1;
        }
    }

    quantizer.load_param(inparam);
    if (strcmp(inbin, "null") == 0)
    {
        DataReaderFromEmpty dr;
        quantizer.load_model(dr);
        quantizer.gen_random_weight = true;
    }
    else
        quantizer.load_model(inbin);

    quantizer.quantize_convolution();
    quantizer.quantize_convolutiondepthwise();
    quantizer.quantize_innerproduct();

    quantizer.fuse_requantize();

    quantizer.save(outparam, outbin);

    return 0;
}